

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O2

void __thiscall wasm::Flatten::visitExpression(Flatten *this,Expression *curr)

{
  pointer *this_00;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *this_01;
  Id IVar1;
  ArenaVector<wasm::Expression_*> *pAVar2;
  undefined8 *puVar3;
  pointer puVar4;
  Type type_00;
  ulong uVar5;
  pointer ppEVar6;
  Flatten *pFVar7;
  Builder BVar8;
  bool bVar9;
  Index index;
  int iVar10;
  Index IVar11;
  iterator iVar12;
  Expression **ppEVar13;
  Module *pMVar14;
  iterator iVar15;
  _Rb_tree_node_base *p_Var16;
  undefined4 extraout_var;
  LocalSet *pLVar17;
  LocalGet *pLVar18;
  Expression *pEVar19;
  mapped_type *pmVar20;
  Type TVar21;
  Expression *pEVar22;
  Expression *pEVar23;
  Expression *expr;
  uint uVar24;
  Type type;
  undefined8 *puVar25;
  pointer puVar26;
  Iterator __first;
  Iterator __last;
  Expression *local_d0;
  Expression *item;
  ExpressionList newList;
  undefined1 local_88 [8];
  Iterator __begin4;
  Module *local_70;
  Expression *curr_local;
  Expression *pEStack_60;
  pointer local_58;
  Flatten *local_50;
  ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
  *local_48;
  Builder local_40;
  Builder builder;
  
  local_58 = (pointer)0x0;
  curr_local = (Expression *)0x0;
  pEStack_60 = (Expression *)0x0;
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
       ).
       super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
       .super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
       super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.currModule;
  local_70 = (Module *)curr;
  bVar9 = Properties::isConstantExpression(curr);
  if (bVar9) goto LAB_0083ee20;
  local_48 = &(this->
              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
              ).
              super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
  ;
  IVar1 = curr->_id;
  local_50 = this;
  if (IVar1 - BlockId < 3) {
LAB_0083e52d:
    __begin4.index = (size_t)&this->preludes;
    iVar12 = std::
             _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)__begin4.index,(key_type *)&local_70);
    pMVar14 = local_70;
    if (iVar12.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      __assert_fail("preludes.find(curr) == preludes.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                    ,0x68,"void wasm::Flatten::visitExpression(Expression *)");
    }
    builder.wasm = local_70;
    IVar1 = *(Id *)&(local_70->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    if (IVar1 == TryId) {
      puVar4 = (local_70->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_01 = &local_70->tags;
      __first.index = 0;
      __first.parent = (ArenaVector<wasm::Expression_*> *)this_01;
      __last.index = (size_t)(local_70->tags).
                             super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
      __last.parent = (ArenaVector<wasm::Expression_*> *)this_01;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      vector<ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::Iterator,void>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&item,__first,__last
                 ,(allocator_type *)local_88);
      TVar21.id = ((Type *)&(pMVar14->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->id;
      __begin4.index = (size_t)puVar4;
      if (1 < TVar21.id) {
        IVar11 = Builder::addVar((this->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .currFunction,TVar21);
        pEVar19 = (Expression *)
                  ((builder.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (1 < (pEVar19->type).id) {
          pLVar17 = Builder::makeLocalSet(&local_40,IVar11,pEVar19);
          ((builder.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pLVar17;
        }
        for (uVar24 = 0; puVar26 = (pointer)(ulong)uVar24,
            puVar26 < ((builder.wasm)->tags).
                      super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; uVar24 = uVar24 + 1) {
          ppEVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                     operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 *)this_01,(size_t)puVar26);
          if (1 < ((*ppEVar13)->type).id) {
            ppEVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                       operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   *)this_01,(size_t)puVar26);
            pLVar17 = Builder::makeLocalSet(&local_40,IVar11,*ppEVar13);
            ppEVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                       operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   *)this_01,(size_t)puVar26);
            *ppEVar13 = (Expression *)pLVar17;
          }
        }
        pMVar14 = (Module *)MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
        this = local_50;
        *(Index *)&(pMVar14->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage = IVar11;
        ((Type *)&(pMVar14->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->id = TVar21.id;
        local_88 = (undefined1  [8])builder.wasm;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                   (Expression **)local_88);
      }
      BVar8.wasm = builder.wasm;
      pEVar19 = getPreludesWithExpression
                          (this,(Expression *)__begin4.index,
                           (Expression *)
                           ((builder.wasm)->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      ((BVar8.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar19;
      for (uVar24 = 0; puVar26 = (pointer)(ulong)uVar24,
          puVar26 < ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; uVar24 = uVar24 + 1) {
        pEVar19 = *(Expression **)(&item->_id + (long)puVar26 * 2);
        ppEVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)this_01,(size_t)puVar26);
        pEVar19 = getPreludesWithExpression(this,pEVar19,*ppEVar13);
        ppEVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)this_01,(size_t)puVar26);
        *ppEVar13 = pEVar19;
      }
      Try::finalize((Try *)builder.wasm);
      ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
      replaceCurrent(local_48,(Expression *)pMVar14);
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&item);
    }
    else if (IVar1 == IfId) {
      pLVar18 = (LocalGet *)
                getPreludesWithExpression
                          (this,(Expression *)
                                (local_70->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Expression *)local_70);
      TVar21.id = ((Type *)&(pMVar14->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->id;
      pEVar19 = (Expression *)
                (pMVar14->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar22 = (Expression *)
                (pMVar14->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      item = (Expression *)0x0;
      pEVar23 = pEVar19;
      if (1 < TVar21.id) {
        IVar11 = Builder::addVar((this->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .currFunction,TVar21);
        pEVar23 = (Expression *)
                  ((builder.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (1 < (pEVar23->type).id) {
          pLVar17 = Builder::makeLocalSet(&local_40,IVar11,pEVar23);
          ((builder.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pLVar17;
        }
        pEVar23 = (Expression *)
                  ((builder.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((pEVar23 != (Expression *)0x0) && (1 < (pEVar23->type).id)) {
          pLVar17 = Builder::makeLocalSet(&local_40,IVar11,pEVar23);
          ((builder.wasm)->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pLVar17;
        }
        item = (Expression *)pLVar18;
        pLVar18 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
        pLVar18->index = IVar11;
        (pLVar18->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             TVar21.id;
        pEVar23 = (Expression *)
                  ((builder.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        this = local_50;
      }
      pEVar19 = getPreludesWithExpression(this,pEVar19,pEVar23);
      ((builder.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar19;
      pEVar19 = (Expression *)
                ((builder.wasm)->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pEVar19 != (Expression *)0x0) {
        pEVar19 = getPreludesWithExpression(this,pEVar22,pEVar19);
        ((builder.wasm)->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar19;
      }
      If::finalize((If *)builder.wasm);
      if (item != (Expression *)0x0) {
        Visitor<wasm::ReFinalizeNode,_void>::visit
                  ((Visitor<wasm::ReFinalizeNode,_void> *)local_88,item);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&curr_local,
                   &item);
      }
      ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
      replaceCurrent(local_48,(Expression *)pLVar18);
    }
    else if (IVar1 == LoopId) {
      TVar21.id = ((Type *)&(local_70->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->id;
      pEVar19 = (Expression *)
                (local_70->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pEVar22 = pEVar19;
      if (1 < TVar21.id) {
        IVar11 = Builder::addVar((this->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .
                                 super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                 .currFunction,TVar21);
        BVar8 = builder;
        __begin4.index = CONCAT44(__begin4.index._4_4_,IVar11);
        pLVar17 = Builder::makeLocalSet
                            (&local_40,IVar11,
                             (Expression *)
                             ((builder.wasm)->functions).
                             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        ((BVar8.wasm)->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pLVar17;
        pMVar14 = (Module *)MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
        *(undefined4 *)
         &(pMVar14->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined4)__begin4.index;
        ((Type *)&(pMVar14->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->id = TVar21.id;
        item = (Expression *)BVar8.wasm;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,&item)
        ;
        ((BVar8.wasm)->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pEVar22 = (Expression *)
                  ((BVar8.wasm)->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      pEVar19 = getPreludesWithExpression(this,pEVar19,pEVar22);
      ((builder.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar19;
      Loop::finalize((Loop *)builder.wasm);
      ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
      replaceCurrent(local_48,(Expression *)pMVar14);
    }
    else {
      if (IVar1 != BlockId) {
        handle_unreachable("unexpected expr type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                           ,0xe5);
      }
      newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements =
           (size_t)&((this->
                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                     ).
                     super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     .
                     super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                     .
                     super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                    .currModule)->allocator;
      newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      item = (Expression *)0x0;
      newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
           (Expression **)0x0;
      this_00 = &(local_70->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar2 = (ArenaVector<wasm::Expression_*> *)
               (local_70->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88 = (undefined1  [8])this_00;
      while ((__begin4.parent != pAVar2 || (local_88 != (undefined1  [8])this_00))) {
        ppEVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)local_88);
        local_d0 = *ppEVar13;
        iVar12 = std::
                 _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)__begin4.index,&local_d0);
        if (iVar12.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          puVar3 = *(undefined8 **)
                    ((long)iVar12.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                           ._M_cur + 0x18);
          for (puVar25 = *(undefined8 **)
                          ((long)iVar12.
                                 super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                 ._M_cur + 0x10); puVar25 != puVar3; puVar25 = puVar25 + 1) {
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)&item
                       ,(Expression *)*puVar25);
          }
          this = local_50;
          if (*(long *)((long)iVar12.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                              ._M_cur + 0x18) !=
              *(long *)((long)iVar12.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                              ._M_cur + 0x10)) {
            *(long *)((long)iVar12.
                            super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                            ._M_cur + 0x18) =
                 *(long *)((long)iVar12.
                                 super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                                 ._M_cur + 0x10);
          }
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)&item,
                   local_d0);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      ((builder.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)item;
      ((builder.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)newList.
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      ((builder.wasm)->globals).
      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)newList.
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                    usedElements;
      newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      item = (Expression *)0x0;
      newList.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
           (Expression **)0x0;
      TVar21.id = (uintptr_t)
                  ((builder.wasm)->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (1 < TVar21.id) {
        iVar15 = std::
                 _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->breakTemps)._M_h,
                        (key_type *)
                        &((builder.wasm)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (iVar15.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur
            == (__node_type *)0x0) {
          IVar11 = Builder::addVar((this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .currFunction,TVar21);
        }
        else {
          IVar11 = *(Index *)((long)iVar15.
                                    super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>
                                    ._M_cur + 0x18);
        }
        ppEVar13 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)this_00);
        if (1 < ((*ppEVar13)->type).id) {
          pLVar17 = Builder::makeLocalSet(&local_40,IVar11,*ppEVar13);
          *ppEVar13 = (Expression *)pLVar17;
        }
        Block::finalize((Block *)builder.wasm,(Type)0x0);
        pLVar18 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
        pLVar18->index = IVar11;
        (pLVar18->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             TVar21.id;
        ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
        replaceCurrent(local_48,(Expression *)pLVar18);
        local_88 = (undefined1  [8])builder.wasm;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                   (Expression **)local_88);
      }
      Block::finalize((Block *)builder.wasm,(Type)0x0);
    }
  }
  else {
    if (IVar1 == NopId) goto LAB_0083ee20;
    if (IVar1 == TryId) goto LAB_0083e52d;
    iVar12 = std::
             _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->preludes)._M_h,(key_type *)&local_70);
    pMVar14 = local_70;
    if (iVar12.
        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pEVar19 = *(Expression **)
                 ((long)iVar12.
                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                        ._M_cur + 0x10);
      pEVar22 = *(Expression **)
                 ((long)iVar12.
                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                        ._M_cur + 0x18);
      ppEVar6 = *(pointer *)
                 ((long)iVar12.
                        super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
                        ._M_cur + 0x20);
      *(Expression **)
       ((long)iVar12.
              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
              ._M_cur + 0x10) = curr_local;
      *(Expression **)
       ((long)iVar12.
              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
              ._M_cur + 0x18) = pEStack_60;
      *(pointer *)
       ((long)iVar12.
              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_false>
              ._M_cur + 0x20) = local_58;
      curr_local = pEVar19;
      pEStack_60 = pEVar22;
      local_58 = ppEVar6;
    }
    IVar1 = *(Id *)&(local_70->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    if (IVar1 == BreakId) {
      pEVar19 = (Expression *)
                (local_70->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pEVar19 != (Expression *)0x0) {
        TVar21.id = (pEVar19->type).id;
        if (TVar21.id < 2) {
          if (TVar21.id != 1) {
            __assert_fail("type == Type::unreachable",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                          ,0x12f,"void wasm::Flatten::visitExpression(Expression *)");
          }
          ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
          ::replaceCurrent(local_48,pEVar19);
        }
        else {
          pEVar19 = ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                    ::findBreakTarget(local_48,(IString)*(IString *)
                                                         &(local_70->exports).
                                                                                                                    
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                     );
          type_00.id = (pEVar19->type).id;
          IVar11 = getTempForBreakTarget
                             (local_50,(IString)*(IString *)
                                                 &(pMVar14->exports).
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                              ,type_00);
          item = (Expression *)
                 Builder::makeLocalSet
                           (&local_40,IVar11,
                            (Expression *)
                            (pMVar14->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                     &item);
          if (TVar21.id != type_00.id) {
            IVar11 = Builder::addVar((local_50->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .
                                     super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                     .currFunction,TVar21);
            iVar10 = ExpressionManipulator::copy
                               ((EVP_PKEY_CTX *)
                                (pMVar14->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                (EVP_PKEY_CTX *)
                                (local_50->
                                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                ).
                                super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                .
                                super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                .
                                super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                .currModule);
            item = (Expression *)
                   Builder::makeLocalSet
                             (&local_40,IVar11,(Expression *)CONCAT44(extraout_var,iVar10));
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                       &item);
          }
          if ((pMVar14->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            item = (Expression *)pMVar14;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                       &item);
            uVar5 = ((Type *)&(pMVar14->exports).
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->id;
            if (uVar5 < 2) {
              if (uVar5 != 1) {
                __assert_fail("br->type == Type::unreachable",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                              ,0x128,"void wasm::Flatten::visitExpression(Expression *)");
              }
              pEVar19 = (Expression *)
                        MixedArena::alloc<wasm::Unreachable>(&(local_40.wasm)->allocator);
              ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
              ::replaceCurrent(local_48,pEVar19);
            }
            else {
              pLVar18 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
              pLVar18->index = IVar11;
              (pLVar18->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id
                   = TVar21.id;
              ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
              ::replaceCurrent(local_48,(Expression *)pLVar18);
            }
          }
          (pMVar14->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          Break::finalize((Break *)pMVar14);
        }
      }
    }
    else if (IVar1 == SwitchId) {
      pEVar19 = (Expression *)
                (local_70->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (pEVar19 != (Expression *)0x0) {
        TVar21.id = (pEVar19->type).id;
        if (TVar21.id < 2) {
          if (TVar21.id != 1) {
            __assert_fail("type == Type::unreachable",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Flatten.cpp"
                          ,0x146,"void wasm::Flatten::visitExpression(Expression *)");
          }
          ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
          ::replaceCurrent(local_48,pEVar19);
        }
        else {
          IVar11 = Builder::addVar((local_50->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .
                                   super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                                   .currFunction,TVar21);
          item = (Expression *)
                 Builder::makeLocalSet
                           (&local_40,IVar11,
                            (Expression *)
                            (pMVar14->globals).
                            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                     &item);
          builder.wasm = pMVar14;
          BranchUtils::getUniqueTargets((NameSet *)&item,(BranchUtils *)pMVar14,expr);
          for (p_Var16 = (_Rb_tree_node_base *)
                         newList.
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                         allocatedElements; p_Var16 != (_Rb_tree_node_base *)&newList;
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
            index = getTempForBreakTarget(local_50,(Name)*(string_view *)(p_Var16 + 1),TVar21);
            pLVar18 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
            pLVar18->index = IVar11;
            (pLVar18->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
                 TVar21.id;
            local_88 = (undefined1  [8])Builder::makeLocalSet(&local_40,index,(Expression *)pLVar18)
            ;
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,
                       (Expression **)local_88);
          }
          ((builder.wasm)->globals).
          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Switch::finalize((Switch *)builder.wasm);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&item);
        }
      }
    }
    else if ((IVar1 == LocalSetId) && (bVar9 = LocalSet::isTee((LocalSet *)local_70), bVar9)) {
      pEVar19 = (Expression *)
                (pMVar14->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pEVar19->type).id == 1) {
        ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
        replaceCurrent(local_48,pEVar19);
      }
      else {
        LocalSet::makeSet((LocalSet *)pMVar14);
        item = (Expression *)pMVar14;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,&item)
        ;
        TVar21 = Function::getLocalType
                           ((local_50->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .
                            super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .
                            super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                            .currFunction,
                            *(Index *)&(pMVar14->exports).
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        IVar11 = *(Index *)&(pMVar14->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pLVar18 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
        pLVar18->index = IVar11;
        (pLVar18->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             TVar21.id;
        ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
        replaceCurrent(local_48,(Expression *)pLVar18);
      }
    }
  }
  local_70 = (Module *)
             *(local_48->
              super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>)
              .super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>.
              replacep;
  Visitor<wasm::ReFinalizeNode,_void>::visit
            ((Visitor<wasm::ReFinalizeNode,_void> *)&item,(Expression *)local_70);
  pFVar7 = local_50;
  TVar21.id = ((Type *)&(local_70->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->id;
  if (TVar21.id != 0) {
    if (TVar21.id == 1) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&curr_local,
                 (value_type *)&local_70);
      pEVar19 = (Expression *)MixedArena::alloc<wasm::Unreachable>(&(local_40.wasm)->allocator);
      ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
      replaceCurrent(local_48,pEVar19);
    }
    else {
      IVar11 = Builder::addVar((local_50->
                               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                               ).
                               super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .
                               super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                               .currFunction,TVar21);
      item = (Expression *)Builder::makeLocalSet(&local_40,IVar11,(Expression *)local_70);
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&curr_local,&item);
      pLVar18 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
      pLVar18->index = IVar11;
      (pLVar18->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           TVar21.id;
      ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>::
      replaceCurrent(local_48,(Expression *)pLVar18);
    }
  }
  if (curr_local != pEStack_60) {
    item = ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
           ::getParent(local_48);
    if ((item == (Expression *)0x0) ||
       (((ulong)item->_id < 0x32 && ((0x200000000000eU >> ((ulong)item->_id & 0x3f) & 1) != 0)))) {
      local_88 = (undefined1  [8])
                 *(pFVar7->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
                  ).
                  super_ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  .
                  super_PostWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  .super_Walker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>
                  .replacep;
      pmVar20 = std::__detail::
                _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pFVar7->preludes,(key_type *)local_88);
      ppEVar6 = (pmVar20->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage;
      pEVar19 = (Expression *)
                (pmVar20->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_start;
      pEVar22 = (Expression *)
                (pmVar20->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_finish;
      (pmVar20->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_start = (pointer)curr_local;
      (pmVar20->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_finish = (pointer)pEStack_60;
      (pmVar20->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage = local_58;
      curr_local = pEVar19;
      pEStack_60 = pEVar22;
      local_58 = ppEVar6;
    }
    else {
      pmVar20 = std::__detail::
                _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pFVar7->preludes,&item);
      pEVar19 = pEStack_60;
      for (pEVar22 = curr_local; pEVar22 != pEVar19; pEVar22 = (Expression *)&pEVar22->type) {
        local_88 = *(undefined1 (*) [8])pEVar22;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  (pmVar20,(value_type *)local_88);
      }
    }
  }
LAB_0083ee20:
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&curr_local);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    std::vector<Expression*> ourPreludes;
    Builder builder(*getModule());

    // Nothing to do for constants and nop.
    if (Properties::isConstantExpression(curr) || curr->is<Nop>()) {
      return;
    }

    if (Properties::isControlFlowStructure(curr)) {
      // handle control flow explicitly. our children do not have control flow,
      // but they do have preludes which we need to set up in the right place

      // no one should have given us preludes, they are on the children
      assert(preludes.find(curr) == preludes.end());

      if (auto* block = curr->dynCast<Block>()) {
        // make a new list, where each item's preludes are added before it
        ExpressionList newList(getModule()->allocator);
        for (auto* item : block->list) {
          auto iter = preludes.find(item);
          if (iter != preludes.end()) {
            auto& itemPreludes = iter->second;
            for (auto* prelude : itemPreludes) {
              newList.push_back(prelude);
            }
            itemPreludes.clear();
          }
          newList.push_back(item);
        }
        block->list.swap(newList);
        // remove a block return value
        auto type = block->type;
        if (type.isConcrete()) {
          // if there is a temp index for breaking to the block, use that
          Index temp;
          auto iter = breakTemps.find(block->name);
          if (iter != breakTemps.end()) {
            temp = iter->second;
          } else {
            temp = builder.addVar(getFunction(), type);
          }
          auto*& last = block->list.back();
          if (last->type.isConcrete()) {
            last = builder.makeLocalSet(temp, last);
          }
          block->finalize(Type::none);
          // and we leave just a get of the value
          auto* rep = builder.makeLocalGet(temp, type);
          replaceCurrent(rep);
          // the whole block is now a prelude
          ourPreludes.push_back(block);
        }
        // the block now has no return value, and may have become unreachable
        block->finalize(Type::none);

      } else if (auto* iff = curr->dynCast<If>()) {
        // condition preludes go before the entire if
        auto* rep = getPreludesWithExpression(iff->condition, iff);
        // arm preludes go in the arms. we must also remove an if value
        auto* originalIfTrue = iff->ifTrue;
        auto* originalIfFalse = iff->ifFalse;
        auto type = iff->type;
        Expression* prelude = nullptr;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (iff->ifTrue->type.isConcrete()) {
            iff->ifTrue = builder.makeLocalSet(temp, iff->ifTrue);
          }
          if (iff->ifFalse && iff->ifFalse->type.isConcrete()) {
            iff->ifFalse = builder.makeLocalSet(temp, iff->ifFalse);
          }
          // the whole if (+any preludes from the condition) is now a prelude
          prelude = rep;
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
        }
        iff->ifTrue = getPreludesWithExpression(originalIfTrue, iff->ifTrue);
        if (iff->ifFalse) {
          iff->ifFalse =
            getPreludesWithExpression(originalIfFalse, iff->ifFalse);
        }
        iff->finalize();
        if (prelude) {
          ReFinalizeNode().visit(prelude);
          ourPreludes.push_back(prelude);
        }
        replaceCurrent(rep);

      } else if (auto* loop = curr->dynCast<Loop>()) {
        // remove a loop value
        Expression* rep = loop;
        auto* originalBody = loop->body;
        auto type = loop->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          loop->body = builder.makeLocalSet(temp, loop->body);
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole if is now a prelude
          ourPreludes.push_back(loop);
          loop->type = Type::none;
        }
        loop->body = getPreludesWithExpression(originalBody, loop->body);
        loop->finalize();
        replaceCurrent(rep);

      } else if (auto* tryy = curr->dynCast<Try>()) {
        // remove a try value
        Expression* rep = tryy;
        auto* originalBody = tryy->body;
        std::vector<Expression*> originalCatchBodies(tryy->catchBodies.begin(),
                                                     tryy->catchBodies.end());
        auto type = tryy->type;
        if (type.isConcrete()) {
          Index temp = builder.addVar(getFunction(), type);
          if (tryy->body->type.isConcrete()) {
            tryy->body = builder.makeLocalSet(temp, tryy->body);
          }
          for (Index i = 0; i < tryy->catchBodies.size(); i++) {
            if (tryy->catchBodies[i]->type.isConcrete()) {
              tryy->catchBodies[i] =
                builder.makeLocalSet(temp, tryy->catchBodies[i]);
            }
          }
          // and we leave just a get of the value
          rep = builder.makeLocalGet(temp, type);
          // the whole try is now a prelude
          ourPreludes.push_back(tryy);
        }
        tryy->body = getPreludesWithExpression(originalBody, tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = getPreludesWithExpression(
            originalCatchBodies[i], tryy->catchBodies[i]);
        }
        tryy->finalize();
        replaceCurrent(rep);

      } else {
        WASM_UNREACHABLE("unexpected expr type");
      }

    } else {
      // for anything else, there may be existing preludes
      auto iter = preludes.find(curr);
      if (iter != preludes.end()) {
        ourPreludes.swap(iter->second);
      }

      // special handling
      if (auto* set = curr->dynCast<LocalSet>()) {
        if (set->isTee()) {
          // we disallow local.tee
          if (set->value->type == Type::unreachable) {
            replaceCurrent(set->value); // trivial, no set happens
          } else {
            // use a set in a prelude + a get
            set->makeSet();
            ourPreludes.push_back(set);
            Type localType = getFunction()->getLocalType(set->index);
            replaceCurrent(builder.makeLocalGet(set->index, localType));
          }
        }

      } else if (auto* br = curr->dynCast<Break>()) {
        if (br->value) {
          auto type = br->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Type blockType = findBreakTarget(br->name)->type;
            Index temp = getTempForBreakTarget(br->name, blockType);
            ourPreludes.push_back(builder.makeLocalSet(temp, br->value));

            // br_if leaves a value on the stack if not taken, which later can
            // be the last element of the enclosing innermost block and flow
            // out. The local we created using 'getTempForBreakTarget' returns
            // the return type of the block this branch is targetting, which may
            // not be the same with the innermost block's return type. For
            // example,
            // (block $any (result anyref)
            //   (block (result funcref)
            //     (local.tee $0
            //       (br_if $any
            //         (ref.null func)
            //         (i32.const 0)
            //       )
            //     )
            //   )
            // )
            // In this case we need two locals to store (ref.null); one with
            // funcref type that's for the target block ($label0) and one more
            // with anyref type in case for flowing out. Here we create the
            // second 'flowing out' local in case two block's types are
            // different.
            if (type != blockType) {
              temp = builder.addVar(getFunction(), type);
              ourPreludes.push_back(builder.makeLocalSet(
                temp, ExpressionManipulator::copy(br->value, *getModule())));
            }

            if (br->condition) {
              // the value must also flow out
              ourPreludes.push_back(br);
              if (br->type.isConcrete()) {
                replaceCurrent(builder.makeLocalGet(temp, type));
              } else {
                assert(br->type == Type::unreachable);
                replaceCurrent(builder.makeUnreachable());
              }
            }
            br->value = nullptr;
            br->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(br->value);
          }
        }

      } else if (auto* sw = curr->dynCast<Switch>()) {
        if (sw->value) {
          auto type = sw->value->type;
          if (type.isConcrete()) {
            // we are sending a value. use a local instead
            Index temp = builder.addVar(getFunction(), type);
            ourPreludes.push_back(builder.makeLocalSet(temp, sw->value));
            // we don't know which break target will be hit - assign to them all
            auto names = BranchUtils::getUniqueTargets(sw);
            for (auto name : names) {
              ourPreludes.push_back(
                builder.makeLocalSet(getTempForBreakTarget(name, type),
                                     builder.makeLocalGet(temp, type)));
            }
            sw->value = nullptr;
            sw->finalize();
          } else {
            assert(type == Type::unreachable);
            // we don't need the br at all
            replaceCurrent(sw->value);
          }
        }
      }
    }

    // continue for general handling of everything, control flow or otherwise
    curr = getCurrent(); // we may have replaced it
    // we have changed children
    ReFinalizeNode().visit(curr);
    if (curr->type == Type::unreachable) {
      ourPreludes.push_back(curr);
      replaceCurrent(builder.makeUnreachable());
    } else if (curr->type.isConcrete()) {
      // use a local
      auto type = curr->type;
      Index temp = builder.addVar(getFunction(), type);
      ourPreludes.push_back(builder.makeLocalSet(temp, curr));
      replaceCurrent(builder.makeLocalGet(temp, type));
    }

    // next, finish up: migrate our preludes if we can
    if (!ourPreludes.empty()) {
      auto* parent = getParent();
      if (parent && !Properties::isControlFlowStructure(parent)) {
        auto& parentPreludes = preludes[parent];
        for (auto* prelude : ourPreludes) {
          parentPreludes.push_back(prelude);
        }
      } else {
        // keep our preludes, parent will handle them
        preludes[getCurrent()].swap(ourPreludes);
      }
    }
  }